

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O2

string * __thiscall
duckdb::Catalog::GetDefaultTableSchema_abi_cxx11_(string *__return_storage_ptr__,Catalog *this)

{
  allocator local_9;
  
  if ((this->default_table_schema)._M_string_length == 0) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"main",&local_9);
  }
  else {
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&this->default_table_schema);
  }
  return __return_storage_ptr__;
}

Assistant:

string Catalog::GetDefaultTableSchema() const {
	return !default_table_schema.empty() ? default_table_schema : DEFAULT_SCHEMA;
}